

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hacklib.c
# Opt level: O0

long longbits(long l)

{
  ulong uVar1;
  long l2;
  long l_local;
  
  uVar1 = (l & 0x55555555U) + ((long)(l & 0xaaaaaaaaU) >> 1);
  uVar1 = (uVar1 & 0x33333333) + ((long)(uVar1 & 0xcccccccc) >> 2);
  uVar1 = (uVar1 & 0xf0f0f0f) + ((long)(uVar1 & 0xf0f0f0f0) >> 4);
  uVar1 = (uVar1 & 0xff00ff) + ((long)(uVar1 & 0xff00ff00) >> 8);
  return (uVar1 & 0xffff) + ((long)(uVar1 & 0xffff0000) >> 0x10);
}

Assistant:

long longbits(long l)
{
    /* http://graphics.stanford.edu/~seander/bithacks.html#CountBitsSetParallel */
    long l2;
    l2 = (l  & 0x55555555L) + ((l  & 0xAAAAAAAAL) >>  1);
    l  = (l2 & 0x33333333L) + ((l2 & 0xCCCCCCCCL) >>  2);
    l2 = (l  & 0x0F0F0F0FL) + ((l  & 0xF0F0F0F0L) >>  4);
    l  = (l2 & 0x00FF00FFL) + ((l2 & 0xFF00FF00L) >>  8);
    l2 = (l  & 0x0000FFFFL) + ((l  & 0xFFFF0000L) >> 16);
    return l2;
}